

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

void tree_sitter_gdscript_external_scanner_destroy(void *payload)

{
  void *__ptr;
  
  if (*(void **)(*payload + 8) != (void *)0x0) {
    free(*(void **)(*payload + 8));
  }
  __ptr = *(void **)(*(long *)((long)payload + 8) + 8);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  free(*payload);
  free(*(void **)((long)payload + 8));
  free(payload);
  return;
}

Assistant:

void tree_sitter_gdscript_external_scanner_destroy(void *payload) {
    Scanner *scanner = (Scanner *)payload;
    VEC_FREE(scanner->indents);
    VEC_FREE(scanner->delimiters);
    free(scanner->indents);
    free(scanner->delimiters);
    free(scanner);
}